

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_Execute(FAudio *audio)

{
  long in_RDI;
  FAudio_OPERATIONSET_Operation *next;
  FAudio_OPERATIONSET_Operation *op;
  FAudio_OPERATIONSET_Operation *pFree;
  FAudio_OPERATIONSET_Operation *op_00;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x134c87);
  op_00 = *(FAudio_OPERATIONSET_Operation **)(in_RDI + 0x80);
  while (op_00 != (FAudio_OPERATIONSET_Operation *)0x0) {
    pFree = op_00->next;
    ExecuteOperation(op_00);
    DeleteOperation(op_00,(FAudioFreeFunc)pFree);
    op_00 = pFree;
  }
  *(undefined8 *)(in_RDI + 0x80) = 0;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x134cf6);
  return;
}

Assistant:

void FAudio_OPERATIONSET_Execute(FAudio *audio)
{
	FAudio_OPERATIONSET_Operation *op, *next;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	op = audio->committedOperations;
	while (op != NULL)
	{
		next = op->next;
		ExecuteOperation(op);
		DeleteOperation(op, audio->pFree);
		op = next;
	}
	audio->committedOperations = NULL;

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}